

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scheme.cpp
# Opt level: O0

void __thiscall implementations::scheme::SchemeFrame::nextExpression(SchemeFrame *this)

{
  bool bVar1;
  reference value;
  __normal_iterator<const_implementations::scheme::cell_*,_std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>_>
  local_20;
  __normal_iterator<const_implementations::scheme::cell_*,_std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>_>
  local_18;
  SchemeFrame *local_10;
  SchemeFrame *this_local;
  
  local_10 = this;
  local_18._M_current =
       (cell *)std::
               vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
               ::cend(&this->expressions);
  bVar1 = __gnu_cxx::operator!=(&this->exp_it,&local_18);
  if (bVar1) {
    __gnu_cxx::
    __normal_iterator<const_implementations::scheme::cell_*,_std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>_>
    ::operator++(&this->exp_it);
    local_20._M_current =
         (cell *)std::
                 vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
                 ::cend(&this->expressions);
    bVar1 = __gnu_cxx::operator!=(&this->exp_it,&local_20);
    if (bVar1) {
      value = __gnu_cxx::
              __normal_iterator<const_implementations::scheme::cell_*,_std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>_>
              ::operator*(&this->exp_it);
      setExpression(this,value);
      this->resolved = false;
    }
    else {
      this->resolved = true;
      cell::operator=(&this->exp,(cell *)nil);
    }
  }
  else {
    this->resolved = true;
    cell::operator=(&this->exp,(cell *)nil);
  }
  return;
}

Assistant:

void nextExpression() {
		if (exp_it != expressions.cend()) {
			++exp_it;
			if (exp_it != expressions.cend()) {
				setExpression(*exp_it);
				resolved = false;
			} else {
				resolved = true;
				exp = nil;
			}
		} else {
			resolved = true;
			exp = nil;
		}
	}